

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sopr.cc
# Opt level: O0

void anon_unknown.dwarf_2333::PrintUsage(ostream *stream)

{
  ostream *poVar1;
  ostream *in_RDI;
  
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI," sopr - perform scalar operations");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"  usage:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"       sopr [ options ] [ infile ] > stdout");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"  options:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -a a         : addition             (double)[  N/A][      x + a ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -s s         : subtraction          (double)[  N/A][      x - s ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -m m         : multiplication       (double)[  N/A][      x * m ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -d d         : division             (double)[  N/A][      x / d ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -r r         : modulo               (double)[  N/A][      x % r ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -p p         : power                (double)[  N/A][      x ^ p ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -l l         : lower bounding       (double)[  N/A][  max(x, l) ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -u u         : upper bounding       (double)[  N/A][  min(x, u) ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -ABS         : absolute                            [        |x| ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -INV         : inverse                             [      1 / x ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -SQR         : square                              [      x ^ 2 ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -SQRT        : square root                         [    x ^ 0.5 ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -LN          : natural logarithm                   [      ln(x) ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -LOG2        : base 2 logarithm                    [    log2(x) ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -LOG10       : base 10 logarithm                   [   log10(x) ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -LOGX X      : base X logarithm     (double)[  N/A][    logX(x) ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -EXP         : exponential                         [      e ^ x ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -POW2        : power of 2                          [      2 ^ x ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -POW10       : power of 10                         [     10 ^ x ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -POWX X      : power of X           (double)[  N/A][      X ^ x ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -FLOOR       : flooring                            [   floor(x) ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -CEIL        : ceiling                             [    ceil(x) ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -ROUND       : rounding                            [   round(x) ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -ROUNDUP     : rounding up                         [ roundup(x) ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -ROUNDDOWN   : rounding down                       [     int(x) ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -UNIT        : unit step                           [       u(x) ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -RAMP        : rectifier                           [   x * u(x) ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -SIGN        : sign                                [     sgn(x) ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -SIN         : sine                                [     sin(x) ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -COS         : cosine                              [     cos(x) ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -TAN         : tangent                             [     tan(x) ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -ASIN        : arcsine                             [    asin(x) ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -ACOS        : arccosine                           [    acos(x) ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -ATAN        : arctangent                          [    atan(x) ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -TANH        : hyperbolic tangent                  [    tanh(x) ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -ATANH       : hyperbolic arctangent               [   atanh(x) ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -magic magic : remove magic number  (double)[  N/A][            ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       -MAGIC MAGIC : replace magic number (double)[  N/A][      MAGIC ]"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"       -h           : print this message");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,
                           "       the following strings can be used as the argument of -a, -s, -m,"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"       -d, -p, -l, -u, -magic, or -MAGIC option:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"           pi       : 3.14159265...");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"           dB       :   20 / ln(10)");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"           cent     : 1200 / ln(2)");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"           semitone :   12 / ln(2)");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"           octave   :    1 / ln(2)");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"           sqrtX    :      sqrt(X)  [ 0.0 <= X <=   ]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"           lnX      :        ln(X)  [ 0.0 <  X <=   ]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"           expX     :       exp(X)  [     <= X <=   ]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"       they are case-insensitive");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"  infile:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"       data sequence                       (double)[stdin]");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"  stdout:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"       data sequence after operations      (double)");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"  notice:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"       if -MAGIC is given before -magic is given, return error");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI," SPTK: version ");
  poVar1 = std::operator<<(poVar1,"4.3");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PrintUsage(std::ostream* stream) {
  // clang-format off
  *stream << std::endl;
  *stream << " sopr - perform scalar operations" << std::endl;
  *stream << std::endl;
  *stream << "  usage:" << std::endl;
  *stream << "       sopr [ options ] [ infile ] > stdout" << std::endl;
  *stream << "  options:" << std::endl;
  *stream << "       -a a         : addition             (double)[  N/A][      x + a ]" << std::endl;  // NOLINT
  *stream << "       -s s         : subtraction          (double)[  N/A][      x - s ]" << std::endl;  // NOLINT
  *stream << "       -m m         : multiplication       (double)[  N/A][      x * m ]" << std::endl;  // NOLINT
  *stream << "       -d d         : division             (double)[  N/A][      x / d ]" << std::endl;  // NOLINT
  *stream << "       -r r         : modulo               (double)[  N/A][      x % r ]" << std::endl;  // NOLINT
  *stream << "       -p p         : power                (double)[  N/A][      x ^ p ]" << std::endl;  // NOLINT
  *stream << "       -l l         : lower bounding       (double)[  N/A][  max(x, l) ]" << std::endl;  // NOLINT
  *stream << "       -u u         : upper bounding       (double)[  N/A][  min(x, u) ]" << std::endl;  // NOLINT
  *stream << "       -ABS         : absolute                            [        |x| ]" << std::endl;  // NOLINT
  *stream << "       -INV         : inverse                             [      1 / x ]" << std::endl;  // NOLINT
  *stream << "       -SQR         : square                              [      x ^ 2 ]" << std::endl;  // NOLINT
  *stream << "       -SQRT        : square root                         [    x ^ 0.5 ]" << std::endl;  // NOLINT
  *stream << "       -LN          : natural logarithm                   [      ln(x) ]" << std::endl;  // NOLINT
  *stream << "       -LOG2        : base 2 logarithm                    [    log2(x) ]" << std::endl;  // NOLINT
  *stream << "       -LOG10       : base 10 logarithm                   [   log10(x) ]" << std::endl;  // NOLINT
  *stream << "       -LOGX X      : base X logarithm     (double)[  N/A][    logX(x) ]" << std::endl;  // NOLINT
  *stream << "       -EXP         : exponential                         [      e ^ x ]" << std::endl;  // NOLINT
  *stream << "       -POW2        : power of 2                          [      2 ^ x ]" << std::endl;  // NOLINT
  *stream << "       -POW10       : power of 10                         [     10 ^ x ]" << std::endl;  // NOLINT
  *stream << "       -POWX X      : power of X           (double)[  N/A][      X ^ x ]" << std::endl;  // NOLINT
  *stream << "       -FLOOR       : flooring                            [   floor(x) ]" << std::endl;  // NOLINT
  *stream << "       -CEIL        : ceiling                             [    ceil(x) ]" << std::endl;  // NOLINT
  *stream << "       -ROUND       : rounding                            [   round(x) ]" << std::endl;  // NOLINT
  *stream << "       -ROUNDUP     : rounding up                         [ roundup(x) ]" << std::endl;  // NOLINT
  *stream << "       -ROUNDDOWN   : rounding down                       [     int(x) ]" << std::endl;  // NOLINT
  *stream << "       -UNIT        : unit step                           [       u(x) ]" << std::endl;  // NOLINT
  *stream << "       -RAMP        : rectifier                           [   x * u(x) ]" << std::endl;  // NOLINT
  *stream << "       -SIGN        : sign                                [     sgn(x) ]" << std::endl;  // NOLINT
  *stream << "       -SIN         : sine                                [     sin(x) ]" << std::endl;  // NOLINT
  *stream << "       -COS         : cosine                              [     cos(x) ]" << std::endl;  // NOLINT
  *stream << "       -TAN         : tangent                             [     tan(x) ]" << std::endl;  // NOLINT
  *stream << "       -ASIN        : arcsine                             [    asin(x) ]" << std::endl;  // NOLINT
  *stream << "       -ACOS        : arccosine                           [    acos(x) ]" << std::endl;  // NOLINT
  *stream << "       -ATAN        : arctangent                          [    atan(x) ]" << std::endl;  // NOLINT
  *stream << "       -TANH        : hyperbolic tangent                  [    tanh(x) ]" << std::endl;  // NOLINT
  *stream << "       -ATANH       : hyperbolic arctangent               [   atanh(x) ]" << std::endl;  // NOLINT
  *stream << "       -magic magic : remove magic number  (double)[  N/A][            ]" << std::endl;  // NOLINT
  *stream << "       -MAGIC MAGIC : replace magic number (double)[  N/A][      MAGIC ]" << std::endl;  // NOLINT
  *stream << "       -h           : print this message" << std::endl;
  *stream << "" << std::endl;
  *stream << "       the following strings can be used as the argument of -a, -s, -m," << std::endl;  // NOLINT
  *stream << "       -d, -p, -l, -u, -magic, or -MAGIC option:" << std::endl;
  *stream << "" << std::endl;
  *stream << "           pi       : 3.14159265..." << std::endl;
  *stream << "           dB       :   20 / ln(10)" << std::endl;
  *stream << "           cent     : 1200 / ln(2)" << std::endl;
  *stream << "           semitone :   12 / ln(2)" << std::endl;
  *stream << "           octave   :    1 / ln(2)" << std::endl;
  *stream << "           sqrtX    :      sqrt(X)  [ 0.0 <= X <=   ]" << std::endl;  // NOLINT
  *stream << "           lnX      :        ln(X)  [ 0.0 <  X <=   ]" << std::endl;  // NOLINT
  *stream << "           expX     :       exp(X)  [     <= X <=   ]" << std::endl;  // NOLINT
  *stream << "" << std::endl;
  *stream << "       they are case-insensitive" << std::endl;
  *stream << "" << std::endl;
  *stream << "  infile:" << std::endl;
  *stream << "       data sequence                       (double)[stdin]" << std::endl;  // NOLINT
  *stream << "  stdout:" << std::endl;
  *stream << "       data sequence after operations      (double)" << std::endl;
  *stream << "  notice:" << std::endl;
  *stream << "       if -MAGIC is given before -magic is given, return error" << std::endl;  // NOLINT
  *stream << std::endl;
  *stream << " SPTK: version " << sptk::kVersion << std::endl;
  *stream << std::endl;
  // clang-format on
}